

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::finalize(FederateState *this)

{
  nanoseconds time;
  FederateStates FVar1;
  bool bVar2;
  element_type *__d;
  long in_RDI;
  ActionMessage grantCheck;
  MessageProcessingResult ret;
  undefined4 in_stack_fffffffffffffd38;
  int32_t in_stack_fffffffffffffd3c;
  ActionMessage *in_stack_fffffffffffffd40;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 uVar3;
  milliseconds in_stack_fffffffffffffd58;
  int32_t index;
  ActionMessage *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int32_t in_stack_fffffffffffffd6c;
  ActionMessage *in_stack_fffffffffffffe20;
  ActionMessage *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int32_t in_stack_fffffffffffffe34;
  MessageTimer *in_stack_fffffffffffffe38;
  nanoseconds in_stack_fffffffffffffe40;
  ActionMessage local_1a8;
  rep local_f0;
  baseType local_e0;
  undefined2 local_b0;
  baseType local_a8;
  MessageProcessingResult local_9;
  
  FVar1 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x57d875);
  if ((FVar1 != FINISHED) &&
     (FVar1 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x57d887), FVar1 != ERRORED)) {
    local_9 = NEXT_STEP;
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x2e8),
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar2) {
      ActionMessage::ActionMessage
                (in_stack_fffffffffffffd60,(action_t)((ulong)in_stack_fffffffffffffd58.__r >> 0x20))
      ;
      ActionMessage::setExtraData(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      local_b0 = 0;
      local_e0 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
      local_a8 = local_e0;
      if (*(int *)(in_RDI + 0x2f4) < 0) {
        std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x57d934);
        local_f0 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                                  ((TimeRepresentation<count_time<9,_long>_> *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1000l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
        in_stack_fffffffffffffd60 = &local_1a8;
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffd40,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        time.__r._4_4_ = in_stack_fffffffffffffe34;
        time.__r._0_4_ = in_stack_fffffffffffffe30;
        in_stack_fffffffffffffd6c =
             MessageTimer::addTimerFromNow
                       ((MessageTimer *)in_stack_fffffffffffffe28,time,in_stack_fffffffffffffe20);
        *(int32_t *)(in_RDI + 0x2f4) = in_stack_fffffffffffffd6c;
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd40);
      }
      else {
        __d = std::
              __shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x57da1d);
        uVar3 = *(undefined4 *)(in_RDI + 0x2f0);
        in_stack_fffffffffffffd58 =
             TimeRepresentation<count_time<9,_long>_>::to_ms
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1000l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                   CONCAT44(uVar3,in_stack_fffffffffffffd50),
                   (duration<long,_std::ratio<1L,_1000L>_> *)__d);
        in_stack_fffffffffffffd40 = (ActionMessage *)&stack0xfffffffffffffd90;
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffd40,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        MessageTimer::updateTimerFromNow
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe28);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd40);
      }
      ActionMessage::~ActionMessage(in_stack_fffffffffffffd40);
    }
    do {
      index = (int32_t)((ulong)in_stack_fffffffffffffd58.__r >> 0x20);
      if (local_9 == HALTED) break;
      local_9 = genericUnspecifiedQueueProcess
                          ((FederateState *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
      index = (int32_t)((ulong)in_stack_fffffffffffffd58.__r >> 0x20);
    } while (local_9 != ERROR_RESULT);
    *(int *)(in_RDI + 0x300) = *(int *)(in_RDI + 0x300) + 1;
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x2e8),
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar2) {
      std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x57db54);
      MessageTimer::cancelTimer((MessageTimer *)in_stack_fffffffffffffd60,index);
    }
  }
  return;
}

Assistant:

void FederateState::finalize()
{
    if ((state == FederateStates::FINISHED) || (state == FederateStates::ERRORED)) {
        return;
    }
    auto ret = MessageProcessingResult::NEXT_STEP;
#ifndef HELICS_DISABLE_ASIO
    if (grantTimeOutPeriod > timeZero) {
        ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
        grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
        grantCheck.counter = 0;
        grantCheck.actionTime = Time::maxVal();
        if (grantTimeoutTimeIndex < 0) {
            grantTimeoutTimeIndex =
                mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(), std::move(grantCheck));
        } else {
            mTimer->updateTimerFromNow(realTimeTimerIndex,
                                       grantTimeOutPeriod.to_ms(),
                                       std::move(grantCheck));
        }
    }
#endif
    while (ret != MessageProcessingResult::HALTED) {
        ret = genericUnspecifiedQueueProcess(false);
        if (ret == MessageProcessingResult::ERROR_RESULT) {
            break;
        }
    }
#ifndef HELICS_DISABLE_ASIO
    ++mGrantCount;
    if (grantTimeOutPeriod > timeZero) {
        mTimer->cancelTimer(grantTimeoutTimeIndex);
    }
#endif
}